

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

void __thiscall czh::lexer::Match::match(Match *this,TokenType *token)

{
  TokenType TVar1;
  Match MVar2;
  undefined8 extraout_RAX;
  pointer unaff_R15;
  string local_48;
  source_location local_28;
  
  while( true ) {
    TVar1 = *token;
    if (TVar1 == NOTE) {
      return;
    }
    if (this->state != REF_ID) break;
    if (TVar1 - FEND < 2) {
LAB_0011dcdf:
      this->state = INIT;
      this->last_state = UNEXPECTED;
      return;
    }
    if (TVar1 == REF) {
switchD_0011dd0e_caseD_7:
      this->state = REF;
      return;
    }
    this->state = INIT;
    this->last_state = UNEXPECTED;
  }
  switch(this->state) {
  case INIT:
    if (TVar1 != SCEND) {
      if (TVar1 == ID) {
        this->state = ID;
        return;
      }
      this->state = UNEXPECTED;
      this->last_state = INIT;
      return;
    }
    break;
  case ID:
    if (TVar1 != COLON) {
      if (TVar1 == EQUAL) {
        this->state = EQUAL;
        return;
      }
      MVar2.state = UNEXPECTED;
      MVar2.last_state = ID;
      goto LAB_0011dd74;
    }
    break;
  case VALUE:
  case ARR_RP:
  case SC_COLON:
  case UNEXPECTED:
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Something unreachable.","")
    ;
    local_28._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019f348;
    czh::error::czh_unreachable(&local_48,&local_28);
  default:
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Something unreachable.","")
    ;
    local_28._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019f378;
    czh::error::czh_unreachable(&local_48,&local_28);
    if (local_48._M_dataplus._M_p != unaff_R15) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  case ARR_VALUE:
    if (TVar1 != ARR_RP) {
      if (TVar1 == COMMA) {
        this->state = COMMA;
        return;
      }
      MVar2.state = UNEXPECTED;
      MVar2.last_state = ARR_VALUE;
      goto LAB_0011dd74;
    }
    break;
  case EQUAL:
    switch(TVar1) {
    case ID:
switchD_0011dd0e_caseD_0:
      this->state = REF_ID;
      return;
    case VALUE:
      break;
    default:
      MVar2.state = UNEXPECTED;
      MVar2.last_state = EQUAL;
      goto LAB_0011dd74;
    case ARR_LP:
      this->state = ARR_LP;
      return;
    case REF:
      goto switchD_0011dd0e_caseD_7;
    }
  case ARR_LP:
    if (TVar1 != ARR_RP) {
      if (TVar1 == VALUE) goto LAB_0011dd2d;
      MVar2.state = UNEXPECTED;
      MVar2.last_state = ARR_LP;
      goto LAB_0011dd74;
    }
    break;
  case COMMA:
    if (TVar1 == VALUE) {
LAB_0011dd2d:
      this->state = ARR_VALUE;
      return;
    }
    MVar2.state = UNEXPECTED;
    MVar2.last_state = COMMA;
    goto LAB_0011dd74;
  case REF:
    if (TVar1 == ID) goto switchD_0011dd0e_caseD_0;
    MVar2.state = UNEXPECTED;
    MVar2.last_state = REF;
LAB_0011dd74:
    *this = MVar2;
    return;
  case END:
    TVar1 = *token;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unexpected end of file.","");
    local_28._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019f360;
    czh::error::czh_assert((TVar1 & ~VALUE) == FEND,&local_48,&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0011dcdf;
  }
  this->state = END;
  return;
}

Assistant:

void match(const token::TokenType &token)
    {
      if (token == token::TokenType::NOTE) return;
      switch (state)
      {
        case State::INIT:
          switch (token)
          {
            case token::TokenType::ID:
              state = State::ID;
              break;
            case token::TokenType::SCEND:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::ID:
          switch (token)
          {
            case token::TokenType::EQUAL:
              state = State::EQUAL;
              break;
            case token::TokenType::COLON:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EQUAL:
          switch (token)
          {
            case token::TokenType::VALUE:
              state = State::END;
              break;
            case token::TokenType::ARR_LP:
              state = State::ARR_LP;
              break;
            case token::TokenType::REF:
              state = State::REF;
              break;
            case token::TokenType::ID:
              state = State::REF_ID;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::ARR_LP:
          switch (token)
          {
            case token::TokenType::VALUE:
              state = State::ARR_VALUE;
              break;
            case token::TokenType::ARR_RP:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::ARR_VALUE:
          switch (token)
          {
            case token::TokenType::COMMA:
              state = State::COMMA;
              break;
            case token::TokenType::ARR_RP:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::COMMA:
          switch (token)
          {
            case token::TokenType::VALUE:
              state = State::ARR_VALUE;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::REF:
          switch (token)
          {
            case token::TokenType::ID:
              state = State::REF_ID;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::REF_ID:
          switch (token)
          {
            case token::TokenType::REF:
              state = State::REF;
              break;
            case token::TokenType::SEND:
            case token::TokenType::FEND:
              reset();
              break;
            default:
              reset();
              match(token);
              break;
          }
          break;
        case State::VALUE:
        case State::ARR_RP:
        case State::SC_COLON:
        case State::UNEXPECTED:
          error::czh_unreachable();
        case State::END:
          error::czh_assert(token == token::TokenType::SEND || token == token::TokenType::FEND,
                            "Unexpected end of file.");
          reset();
          break;
        default:
          error::czh_unreachable();
      }
    }